

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
LinearScan::FillStackLiteralBailOutRecord
          (LinearScan *this,Instr *instr,BailOutInfo *bailOutInfo,FuncBailOutData *funcBailOutData,
          uint funcCount)

{
  uint *puVar1;
  StackSym *pSVar2;
  long lVar3;
  StackLiteralBailOutInfo *pSVar4;
  BailOutRecord *pBVar5;
  StackLiteralBailOutRecord *pSVar6;
  code *pcVar7;
  bool bVar8;
  uint32 uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  BOOL BVar12;
  uint uVar13;
  undefined4 *puVar14;
  Func *pFVar15;
  JITTimeFunctionBody *pJVar16;
  char *pcVar17;
  long lVar18;
  uint i;
  ulong uVar19;
  
  if (bailOutInfo->stackLiteralBailOutInfoCount != 0) {
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar18 = 0;
    uVar19 = 0;
    do {
      pSVar2 = *(StackSym **)((long)&bailOutInfo->stackLiteralBailOutInfo->stackSym + lVar18);
      uVar13 = *(uint *)((long)pSVar2->scratch + 0x78);
      uVar9 = IR::Instr::GetNumber(instr);
      if (uVar9 <= uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7ea,
                           "(stackSym->scratch.linearScan.lifetime->start < instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->start < instr->GetNumber()");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      uVar13 = *(uint *)((long)pSVar2->scratch + 0x7c);
      uVar9 = IR::Instr::GetNumber(instr);
      if (uVar13 < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7eb,
                           "(stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber())",
                           "stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber()");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      RVar10 = StackSym::GetByteCodeRegSlot(pSVar2);
      pFVar15 = StackSym::GetByteCodeFunc(pSVar2);
      uVar13 = pFVar15->inlineDepth;
      if (RVar10 == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f1,"(regSlot != Js::Constants::NoRegister)",
                           "regSlot != Js::Constants::NoRegister");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(pFVar15->m_workItem);
      RVar11 = JITTimeFunctionBody::GetLocalsCount(pJVar16);
      if (RVar11 <= RVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f2,"(regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount())"
                           ,"regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount()");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      if (funcCount <= uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f3,"(index < funcCount)","index < funcCount");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      if (funcBailOutData[uVar13].func != pFVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f4,"(funcBailOutData[index].func == stackSymFunc)",
                           "funcBailOutData[index].func == stackSymFunc");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      if (funcBailOutData[uVar13].localOffsets[RVar10] == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x7f5,"(funcBailOutData[index].localOffsets[regSlot] != 0)",
                           "funcBailOutData[index].localOffsets[regSlot] != 0");
        if (!bVar8) goto LAB_00585958;
        *puVar14 = 0;
      }
      puVar1 = &(funcBailOutData[uVar13].bailOutRecord)->stackLiteralBailOutRecordCount;
      *puVar1 = *puVar1 + 1;
      uVar19 = uVar19 + 1;
      uVar13 = bailOutInfo->stackLiteralBailOutInfoCount;
      lVar18 = lVar18 + 0x10;
    } while (uVar19 < uVar13);
    if (funcCount != 0) {
      pFVar15 = this->func->topFunc;
      lVar18 = 0;
      do {
        uVar19 = (ulong)*(uint *)(*(long *)((long)&funcBailOutData->bailOutRecord + lVar18) + 0x38);
        if (uVar19 != 0) {
          BVar12 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar12 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar8) goto LAB_00585958;
            *puVar14 = 0;
          }
          pcVar17 = NativeCodeData::Allocator::Alloc(&pFVar15->nativeCodeDataAllocator,uVar19 << 3);
          if (pcVar17 == (char *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar8) goto LAB_00585958;
            *puVar14 = 0;
          }
          lVar3 = *(long *)((long)&funcBailOutData->bailOutRecord + lVar18);
          *(char **)(lVar3 + 0x28) = pcVar17;
          *(undefined4 *)(lVar3 + 0x38) = 0;
        }
        lVar18 = lVar18 + 0x28;
      } while ((ulong)funcCount * 0x28 != lVar18);
      uVar13 = bailOutInfo->stackLiteralBailOutInfoCount;
    }
    if (uVar13 != 0) {
      lVar18 = 8;
      uVar19 = 0;
      do {
        pSVar4 = bailOutInfo->stackLiteralBailOutInfo;
        pSVar2 = *(StackSym **)((long)pSVar4 + lVar18 + -8);
        uVar13 = *(uint *)((long)pSVar2->scratch + 0x78);
        uVar9 = IR::Instr::GetNumber(instr);
        if (uVar9 <= uVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7ea,
                             "(stackSym->scratch.linearScan.lifetime->start < instr->GetNumber())",
                             "stackSym->scratch.linearScan.lifetime->start < instr->GetNumber()");
          if (!bVar8) {
LAB_00585958:
            pcVar7 = (code *)invalidInstructionException();
            (*pcVar7)();
          }
          *puVar14 = 0;
        }
        uVar13 = *(uint *)((long)pSVar2->scratch + 0x7c);
        uVar9 = IR::Instr::GetNumber(instr);
        if (uVar13 < uVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7eb,
                             "(stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber())",
                             "stackSym->scratch.linearScan.lifetime->end >= instr->GetNumber()");
          if (!bVar8) goto LAB_00585958;
          *puVar14 = 0;
        }
        RVar10 = StackSym::GetByteCodeRegSlot(pSVar2);
        pFVar15 = StackSym::GetByteCodeFunc(pSVar2);
        uVar13 = pFVar15->inlineDepth;
        if (RVar10 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f1,"(regSlot != Js::Constants::NoRegister)",
                             "regSlot != Js::Constants::NoRegister");
          if (!bVar8) goto LAB_00585958;
          *puVar14 = 0;
        }
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(pFVar15->m_workItem);
        RVar11 = JITTimeFunctionBody::GetLocalsCount(pJVar16);
        if (RVar11 <= RVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f2,
                             "(regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount())",
                             "regSlot < stackSymFunc->GetJITFunctionBody()->GetLocalsCount()");
          if (!bVar8) goto LAB_00585958;
          *puVar14 = 0;
        }
        if (funcCount <= uVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f3,"(index < funcCount)","index < funcCount");
          if (!bVar8) goto LAB_00585958;
          *puVar14 = 0;
        }
        if (funcBailOutData[uVar13].func != pFVar15) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f4,"(funcBailOutData[index].func == stackSymFunc)",
                             "funcBailOutData[index].func == stackSymFunc");
          if (!bVar8) goto LAB_00585958;
          *puVar14 = 0;
        }
        if (funcBailOutData[uVar13].localOffsets[RVar10] == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x7f5,"(funcBailOutData[index].localOffsets[regSlot] != 0)",
                             "funcBailOutData[index].localOffsets[regSlot] != 0");
          if (!bVar8) goto LAB_00585958;
          *puVar14 = 0;
        }
        pBVar5 = funcBailOutData[uVar13].bailOutRecord;
        pSVar6 = pBVar5->stackLiteralBailOutRecord;
        uVar13 = pBVar5->stackLiteralBailOutRecordCount;
        pBVar5->stackLiteralBailOutRecordCount = uVar13 + 1;
        pSVar6[uVar13].regSlot = RVar10;
        pSVar6[uVar13].initFldCount = *(uint *)((long)&pSVar4->stackSym + lVar18);
        uVar19 = uVar19 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar19 < bailOutInfo->stackLiteralBailOutInfoCount);
    }
  }
  return;
}

Assistant:

void
LinearScan::FillStackLiteralBailOutRecord(IR::Instr * instr, BailOutInfo * bailOutInfo, FuncBailOutData * funcBailOutData, uint funcCount)
{
    if (bailOutInfo->stackLiteralBailOutInfoCount)
    {
        // Count the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount++;
        });

        // Allocate the data
        NativeCodeData::Allocator * allocator = this->func->GetNativeCodeDataAllocator();
        for (uint i = 0; i < funcCount; i++)
        {
            uint stackLiteralBailOutRecordCount = funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount;
            if (stackLiteralBailOutRecordCount)
            {
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecord =
                    NativeCodeDataNewArrayNoFixup(allocator, BailOutRecord::StackLiteralBailOutRecord, stackLiteralBailOutRecordCount);
                // reset the count so we can track how much we have filled below
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount = 0;
            }
        }

        // Fill out the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            uint& recordIndex = funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount;
            BailOutRecord::StackLiteralBailOutRecord& stackLiteralBailOutRecord =
                funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecord[recordIndex++];
            stackLiteralBailOutRecord.regSlot = regSlot;
            stackLiteralBailOutRecord.initFldCount = stackLiteralBailOutInfo.initFldCount;
        });
    }
}